

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::HairSetNode::compact_vertices(HairSetNode *this)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  size_type sVar6;
  reference pvVar7;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *pvVar8;
  reference pvVar9;
  Vec3fx *pVVar10;
  unsigned_long *puVar11;
  long in_RDI;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *v_8;
  iterator __end1;
  iterator __begin1;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range1;
  size_t k_2;
  size_t k_1;
  size_t k;
  uint idx;
  size_t i_1;
  size_t i;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  positions_o;
  Vec3fx v_7;
  Vec3fx v_6;
  Vec3fx v_5;
  Vec3fx v_4;
  Vec3fx v_3;
  Vec3fx v_2;
  Vec3fx v_1;
  Vec3fx v;
  size_t i_37;
  size_t i_36;
  Vec3fx *old_items_8;
  size_t i_35;
  size_t i_34;
  size_t i_5;
  size_t i_4;
  Vec3fx *old_items;
  size_t i_3;
  size_t i_2;
  size_t i_9;
  size_t i_8;
  Vec3fx *old_items_1;
  size_t i_7;
  size_t i_6;
  size_t i_13;
  size_t i_12;
  Vec3fx *old_items_2;
  size_t i_11;
  size_t i_10;
  size_t i_17;
  size_t i_16;
  Vec3fx *old_items_3;
  size_t i_15;
  size_t i_14;
  size_t i_21;
  size_t i_20;
  Vec3fx *old_items_4;
  size_t i_19;
  size_t i_18;
  size_t i_25;
  size_t i_24;
  Vec3fx *old_items_5;
  size_t i_23;
  size_t i_22;
  size_t i_29;
  size_t i_28;
  Vec3fx *old_items_6;
  size_t i_27;
  size_t i_26;
  size_t i_33;
  size_t i_32;
  Vec3fx *old_items_7;
  size_t i_31;
  size_t i_30;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  size_t new_size_alloced_2;
  size_t new_size_alloced_3;
  size_t new_size_alloced_4;
  size_t new_size_alloced_5;
  size_t new_size_alloced_6;
  size_t new_size_alloced_7;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff3e8;
  reference in_stack_fffffffffffff3f0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff3f8;
  reference in_stack_fffffffffffff400;
  size_type in_stack_fffffffffffff408;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff410;
  size_t sVar12;
  size_type in_stack_fffffffffffff428;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff430;
  Vec3fx *in_stack_fffffffffffff4d0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff4d8;
  undefined4 in_stack_fffffffffffff4e0;
  uint in_stack_fffffffffffff4e4;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff4e8;
  __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_980;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_978;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_970;
  ulong local_968;
  ulong local_960;
  uint local_954;
  ulong local_950;
  ulong local_948;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  local_928;
  reference local_908;
  reference local_900;
  reference local_8f8;
  reference local_8f0;
  reference local_8e8;
  reference local_8e0;
  ulong local_8d8;
  reference local_8d0;
  ulong local_8c8;
  reference local_8c0;
  ulong local_8b8;
  reference local_8b0;
  ulong local_8a8;
  reference local_8a0;
  ulong local_898;
  reference local_890;
  ulong local_888;
  reference local_880;
  ulong local_878;
  reference local_870;
  ulong local_868;
  reference local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  Vec3fx *local_848;
  reference local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  Vec3fx *local_828;
  reference local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  Vec3fx *local_808;
  reference local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  Vec3fx *local_7e8;
  reference local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  Vec3fx *local_7c8;
  reference local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  Vec3fx *local_7a8;
  reference local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  Vec3fx *local_788;
  reference local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  Vec3fx *local_760;
  reference local_758;
  reference local_750;
  undefined8 *local_748;
  Vec3fx *local_740;
  Vec3fx *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  Vec3fx *local_720;
  Vec3fx *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  Vec3fx *local_700;
  Vec3fx *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  Vec3fx *local_6e0;
  Vec3fx *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  Vec3fx *local_6c0;
  Vec3fx *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  Vec3fx *local_6a0;
  Vec3fx *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  Vec3fx *local_680;
  Vec3fx *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  Vec3fx *local_660;
  Vec3fx *local_658;
  undefined8 *local_650;
  ulong local_648;
  ulong local_640;
  Vec3fx *local_638;
  ulong local_630;
  ulong local_628;
  size_t local_620;
  ulong local_618;
  reference local_610;
  size_t local_608;
  reference local_600;
  Vec3fx *local_5f8;
  Vec3fx *local_5f0;
  Vec3fx *local_5e8;
  Vec3fx *local_5e0;
  size_t local_5d8;
  Vec3fx *local_5d0;
  reference local_5c8;
  ulong local_5c0;
  ulong local_5b8;
  Vec3fx *local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  size_t local_598;
  ulong local_590;
  reference local_588;
  size_t local_580;
  reference local_578;
  Vec3fx *local_570;
  Vec3fx *local_568;
  Vec3fx *local_560;
  Vec3fx *local_558;
  size_t local_550;
  Vec3fx *local_548;
  reference local_540;
  ulong local_538;
  ulong local_530;
  Vec3fx *local_528;
  ulong local_520;
  ulong local_518;
  size_t local_510;
  ulong local_508;
  reference local_500;
  size_t local_4f8;
  reference local_4f0;
  Vec3fx *local_4e8;
  Vec3fx *local_4e0;
  Vec3fx *local_4d8;
  Vec3fx *local_4d0;
  size_t local_4c8;
  Vec3fx *local_4c0;
  reference local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  Vec3fx *local_4a0;
  ulong local_498;
  ulong local_490;
  size_t local_488;
  ulong local_480;
  reference local_478;
  size_t local_470;
  reference local_468;
  Vec3fx *local_460;
  Vec3fx *local_458;
  Vec3fx *local_450;
  Vec3fx *local_448;
  size_t local_440;
  Vec3fx *local_438;
  reference local_430;
  ulong local_428;
  ulong local_420;
  Vec3fx *local_418;
  ulong local_410;
  ulong local_408;
  size_t local_400;
  ulong local_3f8;
  reference local_3f0;
  size_t local_3e8;
  reference local_3e0;
  Vec3fx *local_3d8;
  Vec3fx *local_3d0;
  Vec3fx *local_3c8;
  Vec3fx *local_3c0;
  size_t local_3b8;
  Vec3fx *local_3b0;
  reference local_3a8;
  ulong local_3a0;
  ulong local_398;
  Vec3fx *local_390;
  ulong local_388;
  ulong local_380;
  size_t local_378;
  ulong local_370;
  reference local_368;
  size_t local_360;
  reference local_358;
  Vec3fx *local_350;
  Vec3fx *local_348;
  Vec3fx *local_340;
  Vec3fx *local_338;
  size_t local_330;
  Vec3fx *local_328;
  reference local_320;
  ulong local_318;
  ulong local_310;
  Vec3fx *local_308;
  ulong local_300;
  ulong local_2f8;
  size_t local_2f0;
  ulong local_2e8;
  reference local_2e0;
  size_t local_2d8;
  reference local_2d0;
  Vec3fx *local_2c8;
  Vec3fx *local_2c0;
  Vec3fx *local_2b8;
  Vec3fx *local_2b0;
  size_t local_2a8;
  Vec3fx *local_2a0;
  reference local_298;
  ulong local_290;
  ulong local_288;
  Vec3fx *local_280;
  ulong local_278;
  ulong local_270;
  size_t local_268;
  ulong local_260;
  reference local_258;
  size_t local_250;
  reference local_248;
  Vec3fx *local_240;
  Vec3fx *local_238;
  Vec3fx *local_230;
  Vec3fx *local_228;
  size_t local_220;
  Vec3fx *local_218;
  reference local_210;
  ulong local_208;
  ulong local_200;
  Vec3fx *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  size_t local_1e0;
  ulong local_1d8;
  reference local_1d0;
  size_t local_1c8;
  reference local_1c0;
  Vec3fx *local_1b8;
  Vec3fx *local_1b0;
  Vec3fx *local_1a8;
  Vec3fx *local_1a0;
  size_t local_198;
  Vec3fx *local_190;
  reference local_188;
  unsigned_long local_180 [2];
  ulong local_170;
  ulong local_168;
  reference local_160;
  size_t local_158;
  unsigned_long local_150 [2];
  ulong local_140;
  ulong local_138;
  reference local_130;
  size_t local_128;
  unsigned_long local_120 [2];
  ulong local_110;
  ulong local_108;
  reference local_100;
  size_t local_f8;
  unsigned_long local_f0 [2];
  ulong local_e0;
  ulong local_d8;
  reference local_d0;
  size_t local_c8;
  unsigned_long local_c0 [2];
  ulong local_b0;
  ulong local_a8;
  reference local_a0;
  size_t local_98;
  unsigned_long local_90 [2];
  ulong local_80;
  ulong local_78;
  reference local_70;
  size_t local_68;
  unsigned_long local_60 [2];
  ulong local_50;
  ulong local_48;
  reference local_40;
  size_t local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  reference local_10;
  size_t local_8;
  
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          *)(in_RDI + 0x78));
  std::
  allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>::
  allocator((allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
             *)0x1d0f45);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector(in_stack_fffffffffffff410,in_stack_fffffffffffff408,
           (allocator_type *)in_stack_fffffffffffff400);
  std::
  allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>::
  ~allocator((allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
              *)0x1d0f71);
  for (local_948 = 0; uVar1 = local_948,
      sVar6 = std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      *)(in_RDI + 0x78)), uVar1 < sVar6; local_948 = local_948 + 1) {
    local_8e0 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                              *)(in_RDI + 0x78),local_948);
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::reserve(in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  }
  for (local_950 = 0; uVar1 = local_950,
      sVar6 = std::
              vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                      *)(in_RDI + 0xd8)), uVar1 < sVar6; local_950 = local_950 + 1) {
    pvVar7 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           *)(in_RDI + 0xd8),local_950);
    local_954 = pvVar7->vertex;
    local_8e8 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::operator[](&local_928,0);
    bVar5 = test_location(in_stack_fffffffffffff4e8,
                          CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                          in_stack_fffffffffffff4d8,(ssize_t)in_stack_fffffffffffff4d0);
    if (bVar5) {
      local_8f0 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::operator[](&local_928,0);
      sVar12 = local_8f0->size_active;
      pvVar7 = std::
               vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                             *)(in_RDI + 0xd8),local_950);
      pvVar7->vertex = (int)sVar12 - 1;
      for (local_960 = 0; uVar1 = local_960,
          sVar6 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)(in_RDI + 0x78)), uVar1 < sVar6; local_960 = local_960 + 1) {
        pvVar9 = std::
                 vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ::operator[](&local_928,local_960);
        local_860 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                  *)(in_RDI + 0x78),local_960);
        local_868 = (ulong)(local_954 + 1);
        local_760 = local_860->items + local_868;
        local_730 = &local_778;
        local_778 = *(undefined8 *)&local_760->field_0;
        uStack_770 = *(undefined8 *)((long)&local_760->field_0 + 8);
        uVar1 = pvVar9->size_active;
        local_168 = pvVar9->size_active + 1;
        local_758 = pvVar9;
        local_738 = local_760;
        local_160 = pvVar9;
        if (pvVar9->size_alloced < local_168) {
          sVar12 = local_168;
          if (pvVar9->size_alloced != 0) {
            local_170 = pvVar9->size_alloced;
            while (local_170 < local_168) {
              local_180[1] = 1;
              local_180[0] = local_170 << 1;
              puVar11 = std::max<unsigned_long>(local_180 + 1,local_180);
              local_170 = *puVar11;
            }
            local_158 = local_170;
            sVar12 = local_158;
          }
        }
        else {
          sVar12 = pvVar9->size_alloced;
        }
        local_158 = sVar12;
        local_598 = local_158;
        uVar3 = uVar1;
        if (uVar1 < pvVar9->size_active) {
          while (local_5a0 = uVar3, local_5a0 < pvVar9->size_active) {
            uVar3 = local_5a0 + 1;
          }
          pvVar9->size_active = uVar1;
        }
        local_590 = uVar1;
        local_588 = pvVar9;
        if (local_158 == pvVar9->size_alloced) {
          for (local_5a8 = pvVar9->size_active; local_5a8 < uVar1; local_5a8 = local_5a8 + 1) {
            local_560 = pvVar9->items + local_5a8;
          }
          pvVar9->size_active = uVar1;
        }
        else {
          local_5b0 = pvVar9->items;
          local_580 = local_158;
          local_578 = pvVar9;
          pVVar10 = (Vec3fx *)
                    alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                  (size_t)in_stack_fffffffffffff3f0);
          pvVar9->items = pVVar10;
          for (local_5b8 = 0; local_5b8 < pvVar9->size_active; local_5b8 = local_5b8 + 1) {
            local_568 = pvVar9->items + local_5b8;
            local_570 = local_5b0 + local_5b8;
            uVar2 = *(undefined8 *)((long)&local_570->field_0 + 8);
            *(undefined8 *)&local_568->field_0 = *(undefined8 *)&local_570->field_0;
            *(undefined8 *)((long)&local_568->field_0 + 8) = uVar2;
          }
          for (local_5c0 = pvVar9->size_active; local_5c0 < local_590; local_5c0 = local_5c0 + 1) {
            local_558 = pvVar9->items + local_5c0;
          }
          local_550 = pvVar9->size_alloced;
          local_548 = local_5b0;
          local_540 = pvVar9;
          alignedFree(in_stack_fffffffffffff3e8);
          pvVar9->size_active = local_590;
          pvVar9->size_alloced = local_598;
        }
        sVar12 = pvVar9->size_active;
        pvVar9->size_active = sVar12 + 1;
        local_740 = pvVar9->items + sVar12;
        local_748 = &local_778;
        *(undefined8 *)&local_740->field_0 = local_778;
        *(undefined8 *)((long)&local_740->field_0 + 8) = uStack_770;
        pvVar9 = std::
                 vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ::operator[](&local_928,local_960);
        local_870 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                  *)(in_RDI + 0x78),local_960);
        local_878 = (ulong)(local_954 + 2);
        local_788 = local_870->items + local_878;
        local_710 = &local_798;
        local_798 = *(undefined8 *)&local_788->field_0;
        uStack_790 = *(undefined8 *)((long)&local_788->field_0 + 8);
        uVar1 = pvVar9->size_active;
        local_138 = pvVar9->size_active + 1;
        local_780 = pvVar9;
        local_718 = local_788;
        local_130 = pvVar9;
        if (pvVar9->size_alloced < local_138) {
          sVar12 = local_138;
          if (pvVar9->size_alloced != 0) {
            local_140 = pvVar9->size_alloced;
            while (local_140 < local_138) {
              local_150[1] = 1;
              local_150[0] = local_140 << 1;
              puVar11 = std::max<unsigned_long>(local_150 + 1,local_150);
              local_140 = *puVar11;
            }
            local_128 = local_140;
            sVar12 = local_128;
          }
        }
        else {
          sVar12 = pvVar9->size_alloced;
        }
        local_128 = sVar12;
        local_510 = local_128;
        uVar3 = uVar1;
        if (uVar1 < pvVar9->size_active) {
          while (local_518 = uVar3, local_518 < pvVar9->size_active) {
            uVar3 = local_518 + 1;
          }
          pvVar9->size_active = uVar1;
        }
        local_508 = uVar1;
        local_500 = pvVar9;
        if (local_128 == pvVar9->size_alloced) {
          for (local_520 = pvVar9->size_active; local_520 < uVar1; local_520 = local_520 + 1) {
            local_4d8 = pvVar9->items + local_520;
          }
          pvVar9->size_active = uVar1;
        }
        else {
          local_528 = pvVar9->items;
          local_4f8 = local_128;
          local_4f0 = pvVar9;
          pVVar10 = (Vec3fx *)
                    alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                  (size_t)in_stack_fffffffffffff3f0);
          pvVar9->items = pVVar10;
          for (local_530 = 0; local_530 < pvVar9->size_active; local_530 = local_530 + 1) {
            local_4e0 = pvVar9->items + local_530;
            local_4e8 = local_528 + local_530;
            uVar2 = *(undefined8 *)((long)&local_4e8->field_0 + 8);
            *(undefined8 *)&local_4e0->field_0 = *(undefined8 *)&local_4e8->field_0;
            *(undefined8 *)((long)&local_4e0->field_0 + 8) = uVar2;
          }
          for (local_538 = pvVar9->size_active; local_538 < local_508; local_538 = local_538 + 1) {
            local_4d0 = pvVar9->items + local_538;
          }
          local_4c8 = pvVar9->size_alloced;
          local_4c0 = local_528;
          local_4b8 = pvVar9;
          alignedFree(in_stack_fffffffffffff3e8);
          pvVar9->size_active = local_508;
          pvVar9->size_alloced = local_510;
        }
        sVar12 = pvVar9->size_active;
        pvVar9->size_active = sVar12 + 1;
        local_720 = pvVar9->items + sVar12;
        local_728 = &local_798;
        *(undefined8 *)&local_720->field_0 = local_798;
        *(undefined8 *)((long)&local_720->field_0 + 8) = uStack_790;
        pvVar9 = std::
                 vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ::operator[](&local_928,local_960);
        local_880 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                  *)(in_RDI + 0x78),local_960);
        local_888 = (ulong)(local_954 + 3);
        local_7a8 = local_880->items + local_888;
        local_6f0 = &local_7b8;
        local_7b8 = *(undefined8 *)&local_7a8->field_0;
        uStack_7b0 = *(undefined8 *)((long)&local_7a8->field_0 + 8);
        uVar1 = pvVar9->size_active;
        local_108 = pvVar9->size_active + 1;
        local_7a0 = pvVar9;
        local_6f8 = local_7a8;
        local_100 = pvVar9;
        if (pvVar9->size_alloced < local_108) {
          sVar12 = local_108;
          if (pvVar9->size_alloced != 0) {
            local_110 = pvVar9->size_alloced;
            while (local_110 < local_108) {
              local_120[1] = 1;
              local_120[0] = local_110 << 1;
              puVar11 = std::max<unsigned_long>(local_120 + 1,local_120);
              local_110 = *puVar11;
            }
            local_f8 = local_110;
            sVar12 = local_f8;
          }
        }
        else {
          sVar12 = pvVar9->size_alloced;
        }
        local_f8 = sVar12;
        local_488 = local_f8;
        uVar3 = uVar1;
        if (uVar1 < pvVar9->size_active) {
          while (local_490 = uVar3, local_490 < pvVar9->size_active) {
            uVar3 = local_490 + 1;
          }
          pvVar9->size_active = uVar1;
        }
        local_480 = uVar1;
        local_478 = pvVar9;
        if (local_f8 == pvVar9->size_alloced) {
          for (local_498 = pvVar9->size_active; local_498 < uVar1; local_498 = local_498 + 1) {
            local_450 = pvVar9->items + local_498;
          }
          pvVar9->size_active = uVar1;
        }
        else {
          local_4a0 = pvVar9->items;
          local_470 = local_f8;
          local_468 = pvVar9;
          pVVar10 = (Vec3fx *)
                    alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                  (size_t)in_stack_fffffffffffff3f0);
          pvVar9->items = pVVar10;
          for (local_4a8 = 0; local_4a8 < pvVar9->size_active; local_4a8 = local_4a8 + 1) {
            local_458 = pvVar9->items + local_4a8;
            local_460 = local_4a0 + local_4a8;
            uVar2 = *(undefined8 *)((long)&local_460->field_0 + 8);
            *(undefined8 *)&local_458->field_0 = *(undefined8 *)&local_460->field_0;
            *(undefined8 *)((long)&local_458->field_0 + 8) = uVar2;
          }
          for (local_4b0 = pvVar9->size_active; local_4b0 < local_480; local_4b0 = local_4b0 + 1) {
            local_448 = pvVar9->items + local_4b0;
          }
          local_440 = pvVar9->size_alloced;
          local_438 = local_4a0;
          local_430 = pvVar9;
          alignedFree(in_stack_fffffffffffff3e8);
          pvVar9->size_active = local_480;
          pvVar9->size_alloced = local_488;
        }
        sVar12 = pvVar9->size_active;
        pvVar9->size_active = sVar12 + 1;
        local_700 = pvVar9->items + sVar12;
        local_708 = &local_7b8;
        *(undefined8 *)&local_700->field_0 = local_7b8;
        *(undefined8 *)((long)&local_700->field_0 + 8) = uStack_7b0;
      }
    }
    else {
      local_8f8 = std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::operator[](&local_928,0);
      bVar5 = test_location(in_stack_fffffffffffff4e8,
                            CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0),
                            in_stack_fffffffffffff4d8,(ssize_t)in_stack_fffffffffffff4d0);
      if (bVar5) {
        local_900 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](&local_928,0);
        sVar12 = local_900->size_active;
        pvVar7 = std::
                 vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                               *)(in_RDI + 0xd8),local_950);
        pvVar7->vertex = (int)sVar12 - 3;
        for (local_968 = 0; uVar1 = local_968,
            sVar6 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(in_RDI + 0x78)), uVar1 < sVar6; local_968 = local_968 + 1) {
          pvVar9 = std::
                   vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ::operator[](&local_928,local_968);
          local_890 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    *)(in_RDI + 0x78),local_968);
          local_898 = (ulong)(local_954 + 3);
          local_7c8 = local_890->items + local_898;
          local_6d0 = &local_7d8;
          local_7d8 = *(undefined8 *)&local_7c8->field_0;
          uStack_7d0 = *(undefined8 *)((long)&local_7c8->field_0 + 8);
          uVar1 = pvVar9->size_active;
          local_d8 = pvVar9->size_active + 1;
          local_7c0 = pvVar9;
          local_6d8 = local_7c8;
          local_d0 = pvVar9;
          if (pvVar9->size_alloced < local_d8) {
            sVar12 = local_d8;
            if (pvVar9->size_alloced != 0) {
              local_e0 = pvVar9->size_alloced;
              while (local_e0 < local_d8) {
                local_f0[1] = 1;
                local_f0[0] = local_e0 << 1;
                puVar11 = std::max<unsigned_long>(local_f0 + 1,local_f0);
                local_e0 = *puVar11;
              }
              local_c8 = local_e0;
              sVar12 = local_c8;
            }
          }
          else {
            sVar12 = pvVar9->size_alloced;
          }
          local_c8 = sVar12;
          local_400 = local_c8;
          uVar3 = uVar1;
          if (uVar1 < pvVar9->size_active) {
            while (local_408 = uVar3, local_408 < pvVar9->size_active) {
              uVar3 = local_408 + 1;
            }
            pvVar9->size_active = uVar1;
          }
          local_3f8 = uVar1;
          local_3f0 = pvVar9;
          if (local_c8 == pvVar9->size_alloced) {
            for (local_410 = pvVar9->size_active; local_410 < uVar1; local_410 = local_410 + 1) {
              local_3c8 = pvVar9->items + local_410;
            }
            pvVar9->size_active = uVar1;
          }
          else {
            local_418 = pvVar9->items;
            local_3e8 = local_c8;
            local_3e0 = pvVar9;
            pVVar10 = (Vec3fx *)
                      alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                    (size_t)in_stack_fffffffffffff3f0);
            pvVar9->items = pVVar10;
            for (local_420 = 0; local_420 < pvVar9->size_active; local_420 = local_420 + 1) {
              local_3d0 = pvVar9->items + local_420;
              local_3d8 = local_418 + local_420;
              uVar2 = *(undefined8 *)((long)&local_3d8->field_0 + 8);
              *(undefined8 *)&local_3d0->field_0 = *(undefined8 *)&local_3d8->field_0;
              *(undefined8 *)((long)&local_3d0->field_0 + 8) = uVar2;
            }
            for (local_428 = pvVar9->size_active; local_428 < local_3f8; local_428 = local_428 + 1)
            {
              local_3c0 = pvVar9->items + local_428;
            }
            local_3b8 = pvVar9->size_alloced;
            local_3b0 = local_418;
            local_3a8 = pvVar9;
            alignedFree(in_stack_fffffffffffff3e8);
            pvVar9->size_active = local_3f8;
            pvVar9->size_alloced = local_400;
          }
          sVar12 = pvVar9->size_active;
          pvVar9->size_active = sVar12 + 1;
          local_6e0 = pvVar9->items + sVar12;
          local_6e8 = &local_7d8;
          *(undefined8 *)&local_6e0->field_0 = local_7d8;
          *(undefined8 *)((long)&local_6e0->field_0 + 8) = uStack_7d0;
        }
      }
      else {
        local_908 = std::
                    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ::operator[](&local_928,0);
        in_stack_fffffffffffff4e8 =
             (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              *)local_908->size_active;
        in_stack_fffffffffffff4e4 = (uint)in_stack_fffffffffffff4e8;
        pvVar7 = std::
                 vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                 ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                               *)(in_RDI + 0xd8),local_950);
        pvVar7->vertex = in_stack_fffffffffffff4e4;
        local_970 = (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     *)0x0;
        while (in_stack_fffffffffffff4d8 = local_970,
              pvVar8 = (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        *)std::
                          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                  *)(in_RDI + 0x78)), in_stack_fffffffffffff4d8 < pvVar8) {
          pvVar9 = std::
                   vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ::operator[](&local_928,(size_type)local_970);
          local_8a0 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    *)(in_RDI + 0x78),(size_type)local_970);
          local_8a8 = (ulong)local_954;
          in_stack_fffffffffffff4d0 = local_8a0->items + local_8a8;
          local_6b0 = &local_7f8;
          local_7f8 = *(undefined8 *)&in_stack_fffffffffffff4d0->field_0;
          uStack_7f0 = *(undefined8 *)((long)&in_stack_fffffffffffff4d0->field_0 + 8);
          uVar1 = pvVar9->size_active;
          local_a8 = pvVar9->size_active + 1;
          local_7e8 = in_stack_fffffffffffff4d0;
          local_7e0 = pvVar9;
          local_6b8 = in_stack_fffffffffffff4d0;
          local_a0 = pvVar9;
          if (pvVar9->size_alloced < local_a8) {
            sVar12 = local_a8;
            if (pvVar9->size_alloced != 0) {
              local_b0 = pvVar9->size_alloced;
              while (local_b0 < local_a8) {
                local_c0[1] = 1;
                local_c0[0] = local_b0 << 1;
                puVar11 = std::max<unsigned_long>(local_c0 + 1,local_c0);
                local_b0 = *puVar11;
              }
              local_98 = local_b0;
              sVar12 = local_98;
            }
          }
          else {
            sVar12 = pvVar9->size_alloced;
          }
          local_98 = sVar12;
          local_378 = local_98;
          uVar3 = uVar1;
          if (uVar1 < pvVar9->size_active) {
            while (local_380 = uVar3, local_380 < pvVar9->size_active) {
              uVar3 = local_380 + 1;
            }
            pvVar9->size_active = uVar1;
          }
          local_370 = uVar1;
          local_368 = pvVar9;
          if (local_98 == pvVar9->size_alloced) {
            for (local_388 = pvVar9->size_active; local_388 < uVar1; local_388 = local_388 + 1) {
              local_340 = pvVar9->items + local_388;
            }
            pvVar9->size_active = uVar1;
          }
          else {
            local_390 = pvVar9->items;
            local_360 = local_98;
            local_358 = pvVar9;
            pVVar10 = (Vec3fx *)
                      alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                    (size_t)in_stack_fffffffffffff3f0);
            pvVar9->items = pVVar10;
            for (local_398 = 0; local_398 < pvVar9->size_active; local_398 = local_398 + 1) {
              local_348 = pvVar9->items + local_398;
              local_350 = local_390 + local_398;
              uVar2 = *(undefined8 *)((long)&local_350->field_0 + 8);
              *(undefined8 *)&local_348->field_0 = *(undefined8 *)&local_350->field_0;
              *(undefined8 *)((long)&local_348->field_0 + 8) = uVar2;
            }
            for (local_3a0 = pvVar9->size_active; local_3a0 < local_370; local_3a0 = local_3a0 + 1)
            {
              local_338 = pvVar9->items + local_3a0;
            }
            local_330 = pvVar9->size_alloced;
            local_328 = local_390;
            local_320 = pvVar9;
            alignedFree(in_stack_fffffffffffff3e8);
            pvVar9->size_active = local_370;
            pvVar9->size_alloced = local_378;
          }
          sVar12 = pvVar9->size_active;
          pvVar9->size_active = sVar12 + 1;
          local_6c0 = pvVar9->items + sVar12;
          local_6c8 = &local_7f8;
          *(undefined8 *)&local_6c0->field_0 = local_7f8;
          *(undefined8 *)((long)&local_6c0->field_0 + 8) = uStack_7f0;
          pvVar9 = std::
                   vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ::operator[](&local_928,(size_type)local_970);
          local_8b0 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    *)(in_RDI + 0x78),(size_type)local_970);
          local_8b8 = (ulong)(local_954 + 1);
          local_808 = local_8b0->items + local_8b8;
          local_690 = &local_818;
          local_818 = *(undefined8 *)&local_808->field_0;
          uStack_810 = *(undefined8 *)((long)&local_808->field_0 + 8);
          uVar1 = pvVar9->size_active;
          local_78 = pvVar9->size_active + 1;
          local_800 = pvVar9;
          local_698 = local_808;
          local_70 = pvVar9;
          if (pvVar9->size_alloced < local_78) {
            sVar12 = local_78;
            if (pvVar9->size_alloced != 0) {
              local_80 = pvVar9->size_alloced;
              while (local_80 < local_78) {
                local_90[1] = 1;
                local_90[0] = local_80 << 1;
                puVar11 = std::max<unsigned_long>(local_90 + 1,local_90);
                local_80 = *puVar11;
              }
              local_68 = local_80;
              sVar12 = local_68;
            }
          }
          else {
            sVar12 = pvVar9->size_alloced;
          }
          local_68 = sVar12;
          local_2f0 = local_68;
          uVar3 = uVar1;
          if (uVar1 < pvVar9->size_active) {
            while (local_2f8 = uVar3, local_2f8 < pvVar9->size_active) {
              uVar3 = local_2f8 + 1;
            }
            pvVar9->size_active = uVar1;
          }
          local_2e8 = uVar1;
          local_2e0 = pvVar9;
          if (local_68 == pvVar9->size_alloced) {
            for (local_300 = pvVar9->size_active; local_300 < uVar1; local_300 = local_300 + 1) {
              local_2b8 = pvVar9->items + local_300;
            }
            pvVar9->size_active = uVar1;
          }
          else {
            local_308 = pvVar9->items;
            local_2d8 = local_68;
            local_2d0 = pvVar9;
            pVVar10 = (Vec3fx *)
                      alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                    (size_t)in_stack_fffffffffffff3f0);
            pvVar9->items = pVVar10;
            for (local_310 = 0; local_310 < pvVar9->size_active; local_310 = local_310 + 1) {
              local_2c0 = pvVar9->items + local_310;
              local_2c8 = local_308 + local_310;
              uVar2 = *(undefined8 *)((long)&local_2c8->field_0 + 8);
              *(undefined8 *)&local_2c0->field_0 = *(undefined8 *)&local_2c8->field_0;
              *(undefined8 *)((long)&local_2c0->field_0 + 8) = uVar2;
            }
            for (local_318 = pvVar9->size_active; local_318 < local_2e8; local_318 = local_318 + 1)
            {
              local_2b0 = pvVar9->items + local_318;
            }
            local_2a8 = pvVar9->size_alloced;
            local_2a0 = local_308;
            local_298 = pvVar9;
            alignedFree(in_stack_fffffffffffff3e8);
            pvVar9->size_active = local_2e8;
            pvVar9->size_alloced = local_2f0;
          }
          sVar12 = pvVar9->size_active;
          pvVar9->size_active = sVar12 + 1;
          local_6a0 = pvVar9->items + sVar12;
          local_6a8 = &local_818;
          *(undefined8 *)&local_6a0->field_0 = local_818;
          *(undefined8 *)((long)&local_6a0->field_0 + 8) = uStack_810;
          pvVar9 = std::
                   vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ::operator[](&local_928,(size_type)local_970);
          local_8c0 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    *)(in_RDI + 0x78),(size_type)local_970);
          local_8c8 = (ulong)(local_954 + 2);
          local_828 = local_8c0->items + local_8c8;
          local_670 = &local_838;
          local_838 = *(undefined8 *)&local_828->field_0;
          uStack_830 = *(undefined8 *)((long)&local_828->field_0 + 8);
          uVar1 = pvVar9->size_active;
          local_48 = pvVar9->size_active + 1;
          local_820 = pvVar9;
          local_678 = local_828;
          local_40 = pvVar9;
          if (pvVar9->size_alloced < local_48) {
            sVar12 = local_48;
            if (pvVar9->size_alloced != 0) {
              local_50 = pvVar9->size_alloced;
              while (local_50 < local_48) {
                local_60[1] = 1;
                local_60[0] = local_50 << 1;
                puVar11 = std::max<unsigned_long>(local_60 + 1,local_60);
                local_50 = *puVar11;
              }
              local_38 = local_50;
              sVar12 = local_38;
            }
          }
          else {
            sVar12 = pvVar9->size_alloced;
          }
          local_38 = sVar12;
          local_268 = local_38;
          uVar3 = uVar1;
          if (uVar1 < pvVar9->size_active) {
            while (local_270 = uVar3, local_270 < pvVar9->size_active) {
              uVar3 = local_270 + 1;
            }
            pvVar9->size_active = uVar1;
          }
          local_260 = uVar1;
          local_258 = pvVar9;
          if (local_38 == pvVar9->size_alloced) {
            for (local_278 = pvVar9->size_active; local_278 < uVar1; local_278 = local_278 + 1) {
              local_230 = pvVar9->items + local_278;
            }
            pvVar9->size_active = uVar1;
          }
          else {
            local_280 = pvVar9->items;
            local_250 = local_38;
            local_248 = pvVar9;
            pVVar10 = (Vec3fx *)
                      alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                    (size_t)in_stack_fffffffffffff3f0);
            pvVar9->items = pVVar10;
            for (local_288 = 0; local_288 < pvVar9->size_active; local_288 = local_288 + 1) {
              local_238 = pvVar9->items + local_288;
              local_240 = local_280 + local_288;
              uVar2 = *(undefined8 *)((long)&local_240->field_0 + 8);
              *(undefined8 *)&local_238->field_0 = *(undefined8 *)&local_240->field_0;
              *(undefined8 *)((long)&local_238->field_0 + 8) = uVar2;
            }
            for (local_290 = pvVar9->size_active; local_290 < local_260; local_290 = local_290 + 1)
            {
              local_228 = pvVar9->items + local_290;
            }
            local_220 = pvVar9->size_alloced;
            local_218 = local_280;
            local_210 = pvVar9;
            alignedFree(in_stack_fffffffffffff3e8);
            pvVar9->size_active = local_260;
            pvVar9->size_alloced = local_268;
          }
          sVar12 = pvVar9->size_active;
          pvVar9->size_active = sVar12 + 1;
          local_680 = pvVar9->items + sVar12;
          local_688 = &local_838;
          *(undefined8 *)&local_680->field_0 = local_838;
          *(undefined8 *)((long)&local_680->field_0 + 8) = uStack_830;
          in_stack_fffffffffffff400 =
               std::
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ::operator[](&local_928,(size_type)local_970);
          local_8d0 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                    *)(in_RDI + 0x78),(size_type)local_970);
          local_8d8 = (ulong)(local_954 + 3);
          local_848 = local_8d0->items + local_8d8;
          local_650 = &local_858;
          local_858 = *(undefined8 *)&local_848->field_0;
          uStack_850 = *(undefined8 *)((long)&local_848->field_0 + 8);
          sVar12 = in_stack_fffffffffffff400->size_active;
          local_18 = in_stack_fffffffffffff400->size_active + 1;
          local_840 = in_stack_fffffffffffff400;
          local_658 = local_848;
          local_10 = in_stack_fffffffffffff400;
          if (in_stack_fffffffffffff400->size_alloced < local_18) {
            sVar4 = local_18;
            if (in_stack_fffffffffffff400->size_alloced != 0) {
              local_20 = in_stack_fffffffffffff400->size_alloced;
              while (local_20 < local_18) {
                local_30[1] = 1;
                local_30[0] = local_20 << 1;
                puVar11 = std::max<unsigned_long>(local_30 + 1,local_30);
                local_20 = *puVar11;
              }
              local_8 = local_20;
              sVar4 = local_8;
            }
          }
          else {
            sVar4 = in_stack_fffffffffffff400->size_alloced;
          }
          local_8 = sVar4;
          local_1e0 = local_8;
          uVar1 = sVar12;
          if (sVar12 < in_stack_fffffffffffff400->size_active) {
            while (local_1e8 = uVar1, local_1e8 < in_stack_fffffffffffff400->size_active) {
              uVar1 = local_1e8 + 1;
            }
            in_stack_fffffffffffff400->size_active = sVar12;
          }
          pvVar9 = in_stack_fffffffffffff400;
          local_1d8 = sVar12;
          local_1d0 = in_stack_fffffffffffff400;
          if (local_8 == in_stack_fffffffffffff400->size_alloced) {
            for (local_1f0 = in_stack_fffffffffffff400->size_active; local_1f0 < sVar12;
                local_1f0 = local_1f0 + 1) {
              local_1a8 = in_stack_fffffffffffff400->items + local_1f0;
            }
            in_stack_fffffffffffff400->size_active = sVar12;
          }
          else {
            local_1f8 = in_stack_fffffffffffff400->items;
            local_1c8 = local_8;
            local_1c0 = in_stack_fffffffffffff400;
            in_stack_fffffffffffff3f8 =
                 (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  *)alignedMalloc((size_t)in_stack_fffffffffffff3f8,
                                  (size_t)in_stack_fffffffffffff3f0);
            in_stack_fffffffffffff400->items = (Vec3fx *)in_stack_fffffffffffff3f8;
            for (local_200 = 0; local_200 < in_stack_fffffffffffff400->size_active;
                local_200 = local_200 + 1) {
              local_1b0 = in_stack_fffffffffffff400->items + local_200;
              local_1b8 = local_1f8 + local_200;
              uVar2 = *(undefined8 *)((long)&local_1b8->field_0 + 8);
              *(undefined8 *)&local_1b0->field_0 = *(undefined8 *)&local_1b8->field_0;
              *(undefined8 *)((long)&local_1b0->field_0 + 8) = uVar2;
            }
            for (local_208 = in_stack_fffffffffffff400->size_active; local_208 < local_1d8;
                local_208 = local_208 + 1) {
              local_1a0 = in_stack_fffffffffffff400->items + local_208;
            }
            local_198 = in_stack_fffffffffffff400->size_alloced;
            local_190 = local_1f8;
            local_188 = in_stack_fffffffffffff400;
            alignedFree(in_stack_fffffffffffff3e8);
            in_stack_fffffffffffff400->size_active = local_1d8;
            in_stack_fffffffffffff400->size_alloced = local_1e0;
          }
          sVar12 = pvVar9->size_active;
          pvVar9->size_active = sVar12 + 1;
          local_660 = pvVar9->items + sVar12;
          local_668 = &local_858;
          *(undefined8 *)&local_660->field_0 = local_858;
          *(undefined8 *)((long)&local_660->field_0 + 8) = uStack_850;
          local_970 = (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       *)((long)&(local_970->
                                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1);
        }
      }
    }
  }
  local_978 = &local_928;
  local_980._M_current =
       (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ::begin(in_stack_fffffffffffff3e8);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::end(in_stack_fffffffffffff3e8);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                             *)in_stack_fffffffffffff3f0,
                            (__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                             *)in_stack_fffffffffffff3e8), bVar5) {
    in_stack_fffffffffffff3f0 =
         __gnu_cxx::
         __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
         ::operator*(&local_980);
    local_618 = in_stack_fffffffffffff3f0->size_active;
    local_620 = in_stack_fffffffffffff3f0->size_active;
    uVar1 = local_618;
    if (local_618 < in_stack_fffffffffffff3f0->size_active) {
      while (local_628 = uVar1, local_628 < in_stack_fffffffffffff3f0->size_active) {
        uVar1 = local_628 + 1;
      }
      in_stack_fffffffffffff3f0->size_active = local_618;
    }
    local_750 = in_stack_fffffffffffff3f0;
    local_610 = in_stack_fffffffffffff3f0;
    if (local_620 == in_stack_fffffffffffff3f0->size_alloced) {
      for (local_630 = in_stack_fffffffffffff3f0->size_active; local_630 < local_618;
          local_630 = local_630 + 1) {
        local_5e8 = in_stack_fffffffffffff3f0->items + local_630;
      }
      in_stack_fffffffffffff3f0->size_active = local_618;
    }
    else {
      local_638 = in_stack_fffffffffffff3f0->items;
      local_608 = local_620;
      local_600 = in_stack_fffffffffffff3f0;
      in_stack_fffffffffffff3e8 =
           (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            *)alignedMalloc((size_t)in_stack_fffffffffffff3f8,(size_t)in_stack_fffffffffffff3f0);
      in_stack_fffffffffffff3f0->items = (Vec3fx *)in_stack_fffffffffffff3e8;
      for (local_640 = 0; local_640 < in_stack_fffffffffffff3f0->size_active;
          local_640 = local_640 + 1) {
        local_5f0 = in_stack_fffffffffffff3f0->items + local_640;
        local_5f8 = local_638 + local_640;
        uVar2 = *(undefined8 *)((long)&local_5f8->field_0 + 8);
        *(undefined8 *)&local_5f0->field_0 = *(undefined8 *)&local_5f8->field_0;
        *(undefined8 *)((long)&local_5f0->field_0 + 8) = uVar2;
      }
      for (local_648 = in_stack_fffffffffffff3f0->size_active; local_648 < local_618;
          local_648 = local_648 + 1) {
        local_5e0 = in_stack_fffffffffffff3f0->items + local_648;
      }
      local_5d8 = in_stack_fffffffffffff3f0->size_alloced;
      local_5d0 = local_638;
      local_5c8 = in_stack_fffffffffffff3f0;
      alignedFree(in_stack_fffffffffffff3e8);
      in_stack_fffffffffffff3f0->size_active = local_618;
      in_stack_fffffffffffff3f0->size_alloced = local_620;
    }
    __gnu_cxx::
    __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
    ::operator++(&local_980);
  }
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::operator=((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               *)in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::~vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             *)in_stack_fffffffffffff400);
  return;
}

Assistant:

void SceneGraph::HairSetNode::compact_vertices()
  {
    std::vector<avector<Vec3ff>> positions_o(positions.size());
    for (size_t i=0; i<positions.size(); i++)
      positions_o.reserve(positions[i].size());
    
    for (size_t i=0; i<hairs.size(); i++) 
    {
      unsigned idx = hairs[i].vertex;
      if (test_location(positions,idx,positions_o,positions_o[0].size()-1)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-1;
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }

      else if (test_location(positions,idx,positions_o,positions_o[0].size()-3)) 
      {
        hairs[i].vertex = (unsigned) positions_o[0].size()-3;
        for (size_t k=0; k<positions.size(); k++)
          positions_o[k].push_back(positions[k][idx+3]);
      }

      else
      {
        hairs[i].vertex = (unsigned) positions_o[0].size();
        for (size_t k=0; k<positions.size(); k++) {
          positions_o[k].push_back(positions[k][idx+0]);
          positions_o[k].push_back(positions[k][idx+1]);
          positions_o[k].push_back(positions[k][idx+2]);
          positions_o[k].push_back(positions[k][idx+3]);
        }
      }
    }

    for (auto& v : positions_o)
      v.shrink_to_fit();
   
    positions = std::move(positions_o);
  }